

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::EnableStmtVisitor::~EnableStmtVisitor(EnableStmtVisitor *this)

{
  EnableStmtVisitor *this_local;
  
  ~EnableStmtVisitor(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        // we're only interested in top level blocking assignment
        if (stmt->assign_type() != AssignmentType::Blocking) return;
        auto* left = stmt->left();
        auto str_value = get_ssa_enable_condition(left);
        if (!str_value.empty()) {
            values.emplace(stmt, str_value);
        }
    }